

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSimpleBroadphase.h
# Opt level: O0

int __thiscall btSimpleBroadphase::allocHandle(btSimpleBroadphase *this)

{
  int iVar1;
  int iVar2;
  long in_RDI;
  int freeHandle;
  
  iVar1 = *(int *)(in_RDI + 0x28);
  iVar2 = btSimpleBroadphaseProxy::GetNextFree
                    ((btSimpleBroadphaseProxy *)(*(long *)(in_RDI + 0x18) + (long)iVar1 * 0x40));
  *(int *)(in_RDI + 0x28) = iVar2;
  *(int *)(in_RDI + 8) = *(int *)(in_RDI + 8) + 1;
  if (*(int *)(in_RDI + 0x10) < iVar1) {
    *(int *)(in_RDI + 0x10) = iVar1;
  }
  return iVar1;
}

Assistant:

int allocHandle()
	{
		btAssert(m_numHandles < m_maxHandles);
		int freeHandle = m_firstFreeHandle;
		m_firstFreeHandle = m_pHandles[freeHandle].GetNextFree();
		m_numHandles++;
		if(freeHandle > m_LastHandleIndex)
		{
			m_LastHandleIndex = freeHandle;
		}
		return freeHandle;
	}